

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O0

int Ivy_ManIsAcyclic_rec(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *local_28;
  Ivy_Obj_t *pTemp;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *p_local;
  
  iVar2 = Ivy_ObjIsTravIdPrevious(p,pObj);
  if (iVar2 == 0) {
    iVar2 = Ivy_ObjIsTravIdCurrent(p,pObj);
    if (iVar2 == 0) {
      Ivy_ObjSetTravIdCurrent(p,pObj);
      if (((p->pHaig == (Ivy_Man_t *)0x0) && (pObj->pEquiv != (Ivy_Obj_t *)0x0)) &&
         (iVar2 = Ivy_ObjRefs(pObj), 0 < iVar2)) {
        iVar2 = Ivy_IsComplement(pObj->pEquiv);
        if (iVar2 != 0) {
          __assert_fail("!Ivy_IsComplement(pObj->pEquiv)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivyDfs.c"
                        ,0x139,"int Ivy_ManIsAcyclic_rec(Ivy_Man_t *, Ivy_Obj_t *)");
        }
        for (local_28 = pObj->pEquiv; local_28 != pObj; local_28 = Ivy_Regular(local_28->pEquiv)) {
          iVar2 = Ivy_ManIsAcyclic_rec(p,local_28);
          pFVar1 = _stdout;
          if (iVar2 == 0) {
            uVar3 = Ivy_ObjId(pObj);
            fprintf(pFVar1," -> (%d",(ulong)uVar3);
            for (local_28 = pObj->pEquiv; pFVar1 = _stdout, local_28 != pObj;
                local_28 = Ivy_Regular(local_28->pEquiv)) {
              uVar3 = Ivy_ObjId(local_28);
              fprintf(pFVar1," %d",(ulong)uVar3);
            }
            fprintf(_stdout,")");
            return 0;
          }
        }
      }
      iVar2 = Ivy_ObjIsCi(pObj);
      if ((iVar2 == 0) && (iVar2 = Ivy_ObjIsConst1(pObj), iVar2 == 0)) {
        iVar2 = Ivy_ObjIsNode(pObj);
        if ((iVar2 == 0) && (iVar2 = Ivy_ObjIsBuf(pObj), iVar2 == 0)) {
          __assert_fail("Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/ivy/ivyDfs.c"
                        ,0x14f,"int Ivy_ManIsAcyclic_rec(Ivy_Man_t *, Ivy_Obj_t *)");
        }
        pIVar4 = Ivy_ObjFanin0(pObj);
        iVar2 = Ivy_ManIsAcyclic_rec(p,pIVar4);
        pFVar1 = _stdout;
        if (iVar2 == 0) {
          uVar3 = Ivy_ObjId(pObj);
          fprintf(pFVar1," -> %d",(ulong)uVar3);
          p_local._4_4_ = 0;
        }
        else {
          iVar2 = Ivy_ObjIsNode(pObj);
          if (iVar2 != 0) {
            pIVar4 = Ivy_ObjFanin1(pObj);
            iVar2 = Ivy_ManIsAcyclic_rec(p,pIVar4);
            pFVar1 = _stdout;
            if (iVar2 == 0) {
              uVar3 = Ivy_ObjId(pObj);
              fprintf(pFVar1," -> %d",(ulong)uVar3);
              return 0;
            }
          }
          Ivy_ObjSetTravIdPrevious(p,pObj);
          p_local._4_4_ = 1;
        }
      }
      else {
        Ivy_ObjSetTravIdPrevious(p,pObj);
        p_local._4_4_ = 1;
      }
    }
    else {
      fprintf(_stdout,"Manager contains combinational loop!\n");
      pFVar1 = _stdout;
      uVar3 = Ivy_ObjId(pObj);
      fprintf(pFVar1,"Node \"%d\" is encountered twice on the following path:\n",(ulong)uVar3);
      pFVar1 = _stdout;
      uVar3 = Ivy_ObjId(pObj);
      fprintf(pFVar1," %d",(ulong)uVar3);
      p_local._4_4_ = 0;
    }
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

int Ivy_ManIsAcyclic_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    // skip the node if it is already visited
    if ( Ivy_ObjIsTravIdPrevious(p, pObj) )
        return 1;
    // check if the node is part of the combinational loop
    if ( Ivy_ObjIsTravIdCurrent(p, pObj) )
    {
        fprintf( stdout, "Manager contains combinational loop!\n" );
        fprintf( stdout, "Node \"%d\" is encountered twice on the following path:\n",  Ivy_ObjId(pObj) );
        fprintf( stdout, " %d",  Ivy_ObjId(pObj) );
        return 0;
    }
    // mark this node as a node on the current path
    Ivy_ObjSetTravIdCurrent( p, pObj );
    // explore equivalent nodes if pObj is the main node
    if ( p->pHaig == NULL && pObj->pEquiv && Ivy_ObjRefs(pObj) > 0 )
    {
        Ivy_Obj_t * pTemp;
        assert( !Ivy_IsComplement(pObj->pEquiv) );
        for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
        {
            // traverse the fanin's cone searching for the loop
            if ( !Ivy_ManIsAcyclic_rec(p, pTemp) )
            {
                // return as soon as the loop is detected
                fprintf( stdout, " -> (%d", Ivy_ObjId(pObj) );
                for ( pTemp = pObj->pEquiv; pTemp != pObj; pTemp = Ivy_Regular(pTemp->pEquiv) )
                    fprintf( stdout, " %d", Ivy_ObjId(pTemp) );
                fprintf( stdout, ")" );
                return 0; 
            }
        }
    }
    // quite if it is a CI node
    if ( Ivy_ObjIsCi(pObj) || Ivy_ObjIsConst1(pObj) )
    {
        // mark this node as a visited node
        Ivy_ObjSetTravIdPrevious( p, pObj );
        return 1;
    }
    assert( Ivy_ObjIsNode(pObj) || Ivy_ObjIsBuf(pObj) );
    // traverse the fanin's cone searching for the loop
    if ( !Ivy_ManIsAcyclic_rec(p, Ivy_ObjFanin0(pObj)) )
    {
        // return as soon as the loop is detected
        fprintf( stdout, " -> %d", Ivy_ObjId(pObj) );
        return 0;
    }
    // traverse the fanin's cone searching for the loop
    if ( Ivy_ObjIsNode(pObj) && !Ivy_ManIsAcyclic_rec(p, Ivy_ObjFanin1(pObj)) )
    {
        // return as soon as the loop is detected
        fprintf( stdout, " -> %d", Ivy_ObjId(pObj) );
        return 0;
    }
    // mark this node as a visited node
    Ivy_ObjSetTravIdPrevious( p, pObj );
    return 1;
}